

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scene_instance.cpp
# Opt level: O1

BBox3fa * __thiscall
embree::Instance::boundSegment
          (BBox3fa *__return_storage_ptr__,Instance *this,size_t itime,BBox3fa *obbox0,
          BBox3fa *obbox1,BBox3fa *bbox0,BBox3fa *bbox1,float tmin,float tmax)

{
  AffineSpace3ff *xfm0_00;
  AffineSpace3ff *pAVar1;
  AffineSpace3ff *xfm0;
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_358;
  undefined8 local_348;
  undefined8 uStack_340;
  undefined8 local_338;
  undefined8 uStack_330;
  undefined8 local_328;
  undefined8 uStack_320;
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_318;
  undefined8 local_308;
  undefined8 uStack_300;
  undefined8 local_2f8;
  undefined8 uStack_2f0;
  undefined8 local_2e8;
  undefined8 uStack_2e0;
  MotionDerivativeCoefficients motionDerivCoeffs;
  
  pAVar1 = this->local2world;
  xfm0_00 = pAVar1 + itime;
  if ((this->super_Geometry).field_8.field_0x1 == '\x01') {
    MotionDerivativeCoefficients::MotionDerivativeCoefficients
              (&motionDerivCoeffs,xfm0_00,pAVar1 + itime + 1);
    local_358._0_8_ = *(undefined8 *)&(xfm0_00->l).vx.field_0;
    local_358._8_8_ = *(undefined8 *)((long)&(xfm0_00->l).vx.field_0 + 8);
    local_348 = *(undefined8 *)&(xfm0_00->l).vy.field_0;
    uStack_340 = *(undefined8 *)((long)&(xfm0_00->l).vy.field_0 + 8);
    local_338 = *(undefined8 *)&(xfm0_00->l).vz.field_0;
    uStack_330 = *(undefined8 *)((long)&(xfm0_00->l).vz.field_0 + 8);
    local_328 = *(undefined8 *)&(xfm0_00->p).field_0;
    uStack_320 = *(undefined8 *)((long)&(xfm0_00->p).field_0 + 8);
    local_318._0_8_ = *(undefined8 *)&pAVar1[itime + 1].l.vx.field_0;
    local_318._8_8_ = *(undefined8 *)((long)&pAVar1[itime + 1].l.vx.field_0 + 8);
    local_308 = *(undefined8 *)&pAVar1[itime + 1].l.vy.field_0;
    uStack_300 = *(undefined8 *)((long)&pAVar1[itime + 1].l.vy.field_0 + 8);
    local_2f8 = *(undefined8 *)&pAVar1[itime + 1].l.vz.field_0;
    uStack_2f0 = *(undefined8 *)((long)&pAVar1[itime + 1].l.vz.field_0 + 8);
    local_2e8 = *(undefined8 *)&pAVar1[itime + 1].p.field_0;
    uStack_2e0 = *(undefined8 *)((long)&pAVar1[itime + 1].p.field_0 + 8);
    boundSegmentNonlinear
              (__return_storage_ptr__,&motionDerivCoeffs,(AffineSpace3fa *)&local_358.field_1,
               (AffineSpace3fa *)&local_318.field_1,obbox0,obbox1,bbox0,bbox1,tmin,tmax);
  }
  else {
    motionDerivCoeffs._0_8_ = *(undefined8 *)&(xfm0_00->l).vx.field_0;
    motionDerivCoeffs.coeffs._4_8_ = *(undefined8 *)((long)&(xfm0_00->l).vx.field_0 + 8);
    motionDerivCoeffs.coeffs._12_8_ = *(undefined8 *)&(xfm0_00->l).vy.field_0;
    motionDerivCoeffs.coeffs._20_8_ = *(undefined8 *)((long)&(xfm0_00->l).vy.field_0 + 8);
    motionDerivCoeffs.coeffs._28_8_ = *(undefined8 *)&(xfm0_00->l).vz.field_0;
    motionDerivCoeffs.coeffs._36_8_ = *(undefined8 *)((long)&(xfm0_00->l).vz.field_0 + 8);
    motionDerivCoeffs.coeffs._44_8_ = *(undefined8 *)&(xfm0_00->p).field_0;
    motionDerivCoeffs.coeffs._52_8_ = *(undefined8 *)((long)&(xfm0_00->p).field_0 + 8);
    local_358._0_8_ = *(undefined8 *)&xfm0_00[1].l.vx.field_0;
    local_358._8_8_ = *(undefined8 *)((long)&xfm0_00[1].l.vx.field_0 + 8);
    local_348 = *(undefined8 *)&xfm0_00[1].l.vy.field_0;
    uStack_340 = *(undefined8 *)((long)&xfm0_00[1].l.vy.field_0 + 8);
    local_338 = *(undefined8 *)&xfm0_00[1].l.vz.field_0;
    uStack_330 = *(undefined8 *)((long)&xfm0_00[1].l.vz.field_0 + 8);
    local_328 = *(undefined8 *)&xfm0_00[1].p.field_0;
    uStack_320 = *(undefined8 *)((long)&xfm0_00[1].p.field_0 + 8);
    boundSegmentLinear(__return_storage_ptr__,(AffineSpace3fa *)&motionDerivCoeffs,
                       (AffineSpace3fa *)&local_358.field_1,obbox0,obbox1,bbox0,bbox1,tmin,tmax);
  }
  return __return_storage_ptr__;
}

Assistant:

BBox3fa Instance::boundSegment(size_t itime,
      BBox3fa const& obbox0, BBox3fa const& obbox1,
      BBox3fa const& bbox0, BBox3fa const& bbox1,
      float tmin, float tmax) const
  {
    if (unlikely(gsubtype == GTY_SUBTYPE_INSTANCE_QUATERNION)) {
      auto const& xfm0 = local2world[itime];
      auto const& xfm1 = local2world[itime+1];
      MotionDerivativeCoefficients motionDerivCoeffs(local2world[itime+0], local2world[itime+1]);
      return boundSegmentNonlinear(motionDerivCoeffs, xfm0, xfm1, obbox0, obbox1, bbox0, bbox1, tmin, tmax);
    } else {
      auto const& xfm0 = local2world[itime];
      auto const& xfm1 = local2world[itime+1];
      return boundSegmentLinear(xfm0, xfm1, obbox0, obbox1, bbox0, bbox1, tmin, tmax);
    }
  }